

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearOneof
          (GeneratedMessageReflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  uint32 key;
  CppType CVar1;
  FieldDescriptor *this_00;
  Arena *pAVar2;
  FieldOptions *this_01;
  ArenaStringPtr *pAVar3;
  string *default_value;
  Message **ppMVar4;
  uint32 *puVar5;
  string *default_ptr;
  FieldDescriptor *field;
  uint32 oneof_case;
  OneofDescriptor *oneof_descriptor_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  key = GetOneofCase(this,message,oneof_descriptor);
  if (key != 0) {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    pAVar2 = GetArena(this,message);
    if (pAVar2 == (Arena *)0x0) {
      CVar1 = FieldDescriptor::cpp_type(this_00);
      if (CVar1 == CPPTYPE_STRING) {
        this_01 = FieldDescriptor::options(this_00);
        FieldOptions::ctype(this_01);
        pAVar3 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>(this,this_00);
        default_value = ArenaStringPtr::Get_abi_cxx11_(pAVar3);
        pAVar3 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,this_00);
        pAVar2 = GetArena(this,message);
        ArenaStringPtr::Destroy(pAVar3,default_value,pAVar2);
      }
      else if (CVar1 == CPPTYPE_MESSAGE) {
        ppMVar4 = MutableRaw<google::protobuf::Message*>(this,message,this_00);
        if (*ppMVar4 != (Message *)0x0) {
          (*((*ppMVar4)->super_MessageLite)._vptr_MessageLite[1])();
        }
      }
    }
    puVar5 = MutableOneofCase(this,message,oneof_descriptor);
    *puVar5 = 0;
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::ClearOneof(
    Message* message, const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == NULL) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)->
                  Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}